

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateUninitializedVector
          (FlatBufferBuilderImpl<false> *this,size_t len,size_t elemsize,size_t alignment,
          uint8_t **buf)

{
  uint uVar1;
  uint uVar2;
  
  NotNested(this);
  StartVector<flatbuffers::Offset,unsigned_int>(this,len,elemsize,alignment);
  vector_downward<unsigned_int>::make_space(&this->buf_,elemsize * len);
  uVar1 = (this->buf_).size_;
  uVar2 = EndVector<unsigned_int,unsigned_int>(this,len);
  *buf = (this->buf_).buf_ + ((this->buf_).reserved_ - (ulong)uVar1);
  return uVar2;
}

Assistant:

uoffset_t CreateUninitializedVector(size_t len, size_t elemsize,
                                      size_t alignment, uint8_t **buf) {
    NotNested();
    StartVector(len, elemsize, alignment);
    buf_.make_space(len * elemsize);
    const uoffset_t vec_start = GetSizeRelative32BitRegion();
    auto vec_end = EndVector(len);
    *buf = buf_.data_at(vec_start);
    return vec_end;
  }